

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecyclerObjectGraphDumper.cpp
# Opt level: O1

void __thiscall
Memory::RecyclerObjectGraphDumper::DumpObjectReference
          (RecyclerObjectGraphDumper *this,void *objectAddress,bool remark)

{
  Param *pPVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  char16_t *form;
  
  pPVar1 = this->param;
  if (pPVar1 != (Param *)0x0) {
    if ((pPVar1->dumpRootOnly == true) &&
       ((this->recycler->collectionState).value != CollectionStateFindRoots)) {
      return;
    }
    if (((pPVar1 != (Param *)0x0) &&
        (pPVar1->dumpReferenceFunc != (_func_bool_char16_ptr_void_ptr_void_ptr *)0x0)) &&
       (bVar3 = (*pPVar1->dumpReferenceFunc)(this->dumpObjectName,this->dumpObject,objectAddress),
       !bVar3)) {
      return;
    }
  }
  Output::Print(L"\"");
  if (this->dumpObjectName == (char16 *)0x0) {
    if (this->dumpObject == (void *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/RecyclerObjectGraphDumper.cpp"
                         ,0x5a,"(this->dumpObject != nullptr)","this->dumpObject != nullptr");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar4 = 0;
    }
    RecyclerObjectDumper::DumpObject
              (this->dumpObjectTypeInfo,this->dumpObjectIsArray,this->dumpObject);
  }
  else {
    Output::Print(L"%s");
  }
  form = L"\" -> \"";
  if (remark) {
    form = L"\" => \"";
  }
  Output::Print(form);
  Recycler::DumpObjectDescription(this->recycler,objectAddress);
  Output::Print(L"\"\n");
  return;
}

Assistant:

void RecyclerObjectGraphDumper::DumpObjectReference(void * objectAddress, bool remark)
{
    if (this->param == nullptr || !this->param->dumpRootOnly || recycler->collectionState == CollectionStateFindRoots)
    {
        if (this->param != nullptr && this->param->dumpReferenceFunc)
        {
            if (!this->param->dumpReferenceFunc(this->dumpObjectName, this->dumpObject, objectAddress))
                return;
        }
        Output::Print(_u("\""));
        if (this->dumpObjectName)
        {
            Output::Print(_u("%s"), this->dumpObjectName);
        }
        else
        {
            Assert(this->dumpObject != nullptr);
#ifdef PROFILE_RECYCLER_ALLOC
            RecyclerObjectDumper::DumpObject(this->dumpObjectTypeInfo, this->dumpObjectIsArray, this->dumpObject);
#else
            Output::Print(_u("Address %p"), objectAddress);
#endif
        }

        Output::Print(remark? _u("\" => \"") : _u("\" -> \""));
        recycler->DumpObjectDescription(objectAddress);

        Output::Print(_u("\"\n"));
    }
}